

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O1

void test_string(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  size_t sVar3;
  char *pcVar4;
  long *plVar5;
  VALUE v;
  VALUE local_40;
  
  iVar1 = value_init_string((VALUE *)0x0,"");
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x238,"%s","value_init_string(NULL, \"\") != 0");
  value_init_string(&local_40,(char *)0x0);
  VVar2 = value_type(&local_40);
  acutest_check_((uint)(VVar2 == VALUE_STRING),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x23b,"%s","value_type(&v) == VALUE_STRING");
  sVar3 = value_string_length(&local_40);
  acutest_check_((uint)(sVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x23c,"%s","value_string_length(&v) == 0");
  pcVar4 = value_string(&local_40);
  acutest_check_((uint)(*pcVar4 == '\0'),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x23d,"%s","strcmp(value_string(&v), \"\") == 0");
  value_fini(&local_40);
  value_init_string(&local_40,"");
  VVar2 = value_type(&local_40);
  acutest_check_((uint)(VVar2 == VALUE_STRING),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x241,"%s","value_type(&v) == VALUE_STRING");
  sVar3 = value_string_length(&local_40);
  acutest_check_((uint)(sVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x242,"%s","value_string_length(&v) == 0");
  pcVar4 = value_string(&local_40);
  acutest_check_((uint)(*pcVar4 == '\0'),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x243,"%s","strcmp(value_string(&v), \"\") == 0");
  value_fini(&local_40);
  value_init_string(&local_40,"foo");
  VVar2 = value_type(&local_40);
  acutest_check_((uint)(VVar2 == VALUE_STRING),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x247,"%s","value_type(&v) == VALUE_STRING");
  sVar3 = value_string_length(&local_40);
  acutest_check_((uint)(sVar3 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x248,"%s","value_string_length(&v) == 3");
  pcVar4 = value_string(&local_40);
  iVar1 = strcmp(pcVar4,"foo");
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x249,"%s","strcmp(value_string(&v), \"foo\") == 0");
  value_fini(&local_40);
  value_init_string_(&local_40,"foo bar",3);
  VVar2 = value_type(&local_40);
  acutest_check_((uint)(VVar2 == VALUE_STRING),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x24d,"%s","value_type(&v) == VALUE_STRING");
  sVar3 = value_string_length(&local_40);
  acutest_check_((uint)(sVar3 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x24e,"%s","value_string_length(&v) == 3");
  pcVar4 = value_string(&local_40);
  iVar1 = strcmp(pcVar4,"foo");
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x24f,"%s","strcmp(value_string(&v), \"foo\") == 0");
  value_fini(&local_40);
  value_init_string_(&local_40,"foo",7);
  VVar2 = value_type(&local_40);
  acutest_check_((uint)(VVar2 == VALUE_STRING),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x253,"%s","value_type(&v) == VALUE_STRING");
  sVar3 = value_string_length(&local_40);
  acutest_check_((uint)(sVar3 == 7),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x254,"%s","value_string_length(&v) == 7");
  plVar5 = (long *)value_string(&local_40);
  acutest_check_((uint)(*plVar5 == 0x726162006f6f66),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x255,"%s","memcmp(value_string(&v), \"foo\\0bar\\0\", 8) == 0");
  value_fini(&local_40);
  value_init_string(&local_40,
                    "Lorem ipsum dolor sit amet, consectetuer adipiscing elit. Pellentesque sapien. Maecenas ipsum velit, consectetuer eu lobortis ut, dictum at dui. Nulla pulvinar eleifend sem."
                   );
  VVar2 = value_type(&local_40);
  acutest_check_((uint)(VVar2 == VALUE_STRING),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x259,"%s","value_type(&v) == VALUE_STRING");
  sVar3 = value_string_length(&local_40);
  acutest_check_((uint)(sVar3 == 0xad),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x25a,"%s","value_string_length(&v) == strlen(longstr)");
  pcVar4 = value_string(&local_40);
  iVar1 = strcmp(pcVar4,
                 "Lorem ipsum dolor sit amet, consectetuer adipiscing elit. Pellentesque sapien. Maecenas ipsum velit, consectetuer eu lobortis ut, dictum at dui. Nulla pulvinar eleifend sem."
                );
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x25b,"%s","strcmp(value_string(&v), longstr) == 0");
  value_fini(&local_40);
  value_init_string_(&local_40,
                     "Lorem ipsum dolor sit amet, consectetuer adipiscing elit. Pellentesque sapien. Maecenas ipsum velit, consectetuer eu lobortis ut, dictum at dui. Nulla pulvinar eleifend sem."
                     ,0xad);
  VVar2 = value_type(&local_40);
  acutest_check_((uint)(VVar2 == VALUE_STRING),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x25f,"%s","value_type(&v) == VALUE_STRING");
  sVar3 = value_string_length(&local_40);
  acutest_check_((uint)(sVar3 == 0xad),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x260,"%s","value_string_length(&v) == strlen(longstr)");
  pcVar4 = value_string(&local_40);
  iVar1 = strcmp(pcVar4,
                 "Lorem ipsum dolor sit amet, consectetuer adipiscing elit. Pellentesque sapien. Maecenas ipsum velit, consectetuer eu lobortis ut, dictum at dui. Nulla pulvinar eleifend sem."
                );
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x261,"%s","strcmp(value_string(&v), longstr) == 0");
  value_fini(&local_40);
  return;
}

Assistant:

static void
test_string(void)
{
    /* String long enough to not inline the string inside the value structure. */
    static const char longstr[] =
            "Lorem ipsum dolor sit amet, consectetuer adipiscing elit. "
            "Pellentesque sapien. Maecenas ipsum velit, consectetuer eu "
            "lobortis ut, dictum at dui. Nulla pulvinar eleifend sem.";

    VALUE v;

    TEST_CHECK(value_init_string(NULL, "") != 0);

    value_init_string(&v, NULL);                /* Same as "". */
    TEST_CHECK(value_type(&v) == VALUE_STRING);
    TEST_CHECK(value_string_length(&v) == 0);
    TEST_CHECK(strcmp(value_string(&v), "") == 0);
    value_fini(&v);

    value_init_string(&v, "");
    TEST_CHECK(value_type(&v) == VALUE_STRING);
    TEST_CHECK(value_string_length(&v) == 0);
    TEST_CHECK(strcmp(value_string(&v), "") == 0);
    value_fini(&v);

    value_init_string(&v, "foo");
    TEST_CHECK(value_type(&v) == VALUE_STRING);
    TEST_CHECK(value_string_length(&v) == 3);
    TEST_CHECK(strcmp(value_string(&v), "foo") == 0);
    value_fini(&v);

    value_init_string_(&v, "foo bar", 3);       /* Explicit count of bytes. */
    TEST_CHECK(value_type(&v) == VALUE_STRING);
    TEST_CHECK(value_string_length(&v) == 3);
    TEST_CHECK(strcmp(value_string(&v), "foo") == 0);
    value_fini(&v);

    value_init_string_(&v, "foo\0bar", 7);      /* Zero byte in the middle. */
    TEST_CHECK(value_type(&v) == VALUE_STRING);
    TEST_CHECK(value_string_length(&v) == 7);
    TEST_CHECK(memcmp(value_string(&v), "foo\0bar\0", 8) == 0);
    value_fini(&v);

    value_init_string(&v, longstr);
    TEST_CHECK(value_type(&v) == VALUE_STRING);
    TEST_CHECK(value_string_length(&v) == strlen(longstr));
    TEST_CHECK(strcmp(value_string(&v), longstr) == 0);
    value_fini(&v);

    value_init_string_(&v, longstr, strlen(longstr));
    TEST_CHECK(value_type(&v) == VALUE_STRING);
    TEST_CHECK(value_string_length(&v) == strlen(longstr));
    TEST_CHECK(strcmp(value_string(&v), longstr) == 0);
    value_fini(&v);
}